

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

bool __thiscall woff2::Buffer::ReadU16(Buffer *this,uint16_t *value)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = this->length_;
  uVar1 = this->offset_ + 2;
  if (uVar1 <= uVar2) {
    *value = *(ushort *)(this->buffer_ + this->offset_) << 8 |
             *(ushort *)(this->buffer_ + this->offset_) >> 8;
    this->offset_ = uVar1;
  }
  return uVar1 <= uVar2;
}

Assistant:

bool ReadU16(uint16_t *value) {
    if (offset_ + 2 > length_) {
      return FONT_COMPRESSION_FAILURE();
    }
    std::memcpy(value, buffer_ + offset_, sizeof(uint16_t));
    *value = ntohs(*value);
    offset_ += 2;
    return true;
  }